

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.cpp
# Opt level: O1

model_t * __thiscall cfgfile::generator::cfg::model_t::operator=(model_t *this,model_t *other)

{
  if (this != other) {
    namespace_t::operator=(&this->m_root,&other->m_root);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&this->m_global_includes,&other->m_global_includes);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&this->m_relative_includes,&other->m_relative_includes);
    std::__cxx11::string::_M_assign((string *)&this->m_include_guard);
  }
  return this;
}

Assistant:

model_t &
model_t::operator = ( const model_t & other )
{
	if( this != &other )
	{
		m_root = other.root_namespace();
		m_global_includes = other.global_includes();
		m_relative_includes = other.relative_includes();
		m_include_guard = other.include_guard();
	}

	return *this;
}